

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

Vec_Ptr_t * Cnf_ManScanMapping(Cnf_Man_t *p,int fCollect,int fPreorder)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  
  for (iVar4 = 0; pVVar3 = p->pManAig->vObjs, iVar4 < pVVar3->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(pVVar3,iVar4);
    if (pvVar2 != (void *)0x0) {
      *(uint *)((long)pvVar2 + 0x18) = *(uint *)((long)pvVar2 + 0x18) & 0x3f;
    }
  }
  iVar4 = 0;
  if (fCollect == 0) {
    pVVar3 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar3 = Vec_PtrAlloc(1000);
  }
  p->aArea = 0;
  for (; p_00 = p->pManAig->vCos, iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p_00,iVar4);
    iVar1 = Cnf_ManScanMapping_rec
                      (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),pVVar3,
                       fPreorder);
    p->aArea = p->aArea + iVar1;
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Cnf_ManScanMapping( Cnf_Man_t * p, int fCollect, int fPreorder )
{
    Vec_Ptr_t * vMapped = NULL;
    Aig_Obj_t * pObj;
    int i;
    // clean all references
    Aig_ManForEachObj( p->pManAig, pObj, i )
        pObj->nRefs = 0;
    // allocate the array
    if ( fCollect )
        vMapped = Vec_PtrAlloc( 1000 );
    // collect nodes reachable from POs in the DFS order through the best cuts
    p->aArea = 0;
    Aig_ManForEachCo( p->pManAig, pObj, i )
        p->aArea += Cnf_ManScanMapping_rec( p, Aig_ObjFanin0(pObj), vMapped, fPreorder );
//    printf( "Variables = %6d. Clauses = %8d.\n", vMapped? Vec_PtrSize(vMapped) + Aig_ManCiNum(p->pManAig) + 1 : 0, p->aArea + 2 );
    return vMapped;
}